

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

ostream * argagg::operator<<(ostream *os,parser *x)

{
  pointer pdVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  int iVar4;
  undefined8 in_RAX;
  ostream *poVar5;
  definition *definition;
  pointer pdVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  pointer pbVar7;
  undefined8 uStack_38;
  
  pdVar1 = (x->definitions).
           super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uStack_38 = in_RAX;
  for (pdVar6 = (x->definitions).
                super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar6 != pdVar1; pdVar6 = pdVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
    pbVar2 = (pdVar6->flags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pdVar6->flags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
      pbVar3 = (pdVar6->flags).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __n = pbVar7->_M_string_length;
      if ((__n != pbVar3[-1]._M_string_length) ||
         ((__n != 0 &&
          (iVar4 = bcmp((pbVar7->_M_dataplus)._M_p,pbVar3[-1]._M_dataplus._M_p,__n), iVar4 != 0))))
      {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n        ",9);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pdVar6->help)._M_dataplus._M_p,(pdVar6->help)._M_string_length);
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)((long)&uStack_38 + 7),1);
  }
  return os;
}

Assistant:

inline
std::ostream& operator << (std::ostream& os, const argagg::parser& x)
{
  for (auto& definition : x.definitions) {
    os << "    ";
    for (auto& flag : definition.flags) {
      os << flag;
      if (flag != definition.flags.back()) {
        os << ", ";
      }
    }
    os << "\n        " << definition.help << '\n';
  }
  return os;
}